

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testIsComplete.cpp
# Opt level: O0

void anon_unknown.dwarf_138623::checkFiles
               (char *completeScanLinesName,char *incompleteScanLinesName,char *completeTilesName,
               char *incompleteTilesName)

{
  char *pcVar1;
  byte bVar2;
  int iVar3;
  char *in_RCX;
  char *in_RDX;
  char *in_RSI;
  char *in_RDI;
  TiledRgbaInputFile in_5;
  TiledRgbaInputFile in_4;
  RgbaInputFile in_3;
  RgbaInputFile in_2;
  RgbaInputFile in_1;
  RgbaInputFile in;
  TiledRgbaInputFile local_1a0 [56];
  TiledRgbaInputFile local_168 [56];
  RgbaInputFile local_130 [64];
  RgbaInputFile local_f0 [64];
  RgbaInputFile local_b0 [80];
  RgbaInputFile local_60 [64];
  char *local_20;
  char *local_18;
  char *local_10;
  
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  iVar3 = Imf_3_4::globalThreadCount();
  Imf_3_4::RgbaInputFile::RgbaInputFile(local_60,in_RDI,iVar3);
  bVar2 = Imf_3_4::RgbaInputFile::isComplete();
  if ((bVar2 & 1) == 0) {
    __assert_fail("in.isComplete ()",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testIsComplete.cpp"
                  ,0x53,
                  "void (anonymous namespace)::checkFiles(const char *, const char *, const char *, const char *)"
                 );
  }
  Imf_3_4::RgbaInputFile::~RgbaInputFile(local_60);
  iVar3 = Imf_3_4::globalThreadCount();
  Imf_3_4::RgbaInputFile::RgbaInputFile(local_b0,local_10,iVar3);
  bVar2 = Imf_3_4::RgbaInputFile::isComplete();
  if (((bVar2 ^ 0xff) & 1) == 0) {
    __assert_fail("!in.isComplete ()",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testIsComplete.cpp"
                  ,0x58,
                  "void (anonymous namespace)::checkFiles(const char *, const char *, const char *, const char *)"
                 );
  }
  Imf_3_4::RgbaInputFile::~RgbaInputFile(local_b0);
  pcVar1 = local_18;
  iVar3 = Imf_3_4::globalThreadCount();
  Imf_3_4::RgbaInputFile::RgbaInputFile(local_f0,pcVar1,iVar3);
  bVar2 = Imf_3_4::RgbaInputFile::isComplete();
  if ((bVar2 & 1) == 0) {
    __assert_fail("in.isComplete ()",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testIsComplete.cpp"
                  ,0x5d,
                  "void (anonymous namespace)::checkFiles(const char *, const char *, const char *, const char *)"
                 );
  }
  Imf_3_4::RgbaInputFile::~RgbaInputFile(local_f0);
  pcVar1 = local_20;
  iVar3 = Imf_3_4::globalThreadCount();
  Imf_3_4::RgbaInputFile::RgbaInputFile(local_130,pcVar1,iVar3);
  bVar2 = Imf_3_4::RgbaInputFile::isComplete();
  if (((bVar2 ^ 0xff) & 1) == 0) {
    __assert_fail("!in.isComplete ()",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testIsComplete.cpp"
                  ,0x62,
                  "void (anonymous namespace)::checkFiles(const char *, const char *, const char *, const char *)"
                 );
  }
  Imf_3_4::RgbaInputFile::~RgbaInputFile(local_130);
  iVar3 = Imf_3_4::globalThreadCount();
  Imf_3_4::TiledRgbaInputFile::TiledRgbaInputFile(local_168,local_18,iVar3);
  bVar2 = Imf_3_4::TiledRgbaInputFile::isComplete();
  if ((bVar2 & 1) == 0) {
    __assert_fail("in.isComplete ()",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testIsComplete.cpp"
                  ,0x67,
                  "void (anonymous namespace)::checkFiles(const char *, const char *, const char *, const char *)"
                 );
  }
  Imf_3_4::TiledRgbaInputFile::~TiledRgbaInputFile(local_168);
  iVar3 = Imf_3_4::globalThreadCount();
  Imf_3_4::TiledRgbaInputFile::TiledRgbaInputFile(local_1a0,local_20,iVar3);
  bVar2 = Imf_3_4::TiledRgbaInputFile::isComplete();
  if (((bVar2 ^ 0xff) & 1) == 0) {
    __assert_fail("!in.isComplete ()",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testIsComplete.cpp"
                  ,0x6c,
                  "void (anonymous namespace)::checkFiles(const char *, const char *, const char *, const char *)"
                 );
  }
  Imf_3_4::TiledRgbaInputFile::~TiledRgbaInputFile(local_1a0);
  return;
}

Assistant:

void
checkFiles (
    const char completeScanLinesName[],
    const char incompleteScanLinesName[],
    const char completeTilesName[],
    const char incompleteTilesName[])
{
    {
        RgbaInputFile in (completeScanLinesName);
        assert (in.isComplete ());
    }

    {
        RgbaInputFile in (incompleteScanLinesName);
        assert (!in.isComplete ());
    }

    {
        RgbaInputFile in (completeTilesName);
        assert (in.isComplete ());
    }

    {
        RgbaInputFile in (incompleteTilesName);
        assert (!in.isComplete ());
    }

    {
        TiledRgbaInputFile in (completeTilesName);
        assert (in.isComplete ());
    }

    {
        TiledRgbaInputFile in (incompleteTilesName);
        assert (!in.isComplete ());
    }
}